

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_image.cc
# Opt level: O2

void __thiscall InputImage::InputImage(InputImage *this,char *filename)

{
  istream *this_00;
  Complex *pCVar1;
  ostream *poVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  float real;
  Complex local_240;
  ifstream ifs;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&ifs,filename,_S_in);
  if ((abStack_218[*(long *)(_ifs + -0x18)] & 5) == 0) {
    this_00 = (istream *)std::istream::operator>>((istream *)&ifs,&this->w);
    std::istream::operator>>(this_00,&this->h);
    lVar4 = (long)this->h * (long)this->w;
    uVar6 = lVar4 * 8;
    iVar3 = (int)lVar4;
    uVar5 = 0xffffffffffffffff;
    if (-1 < iVar3) {
      uVar5 = uVar6;
    }
    pCVar1 = (Complex *)operator_new__(uVar5);
    if (iVar3 != 0) {
      uVar5 = 0;
      do {
        Complex::Complex((Complex *)((long)&pCVar1->real + uVar5));
        uVar5 = uVar5 + 8;
      } while (uVar6 != uVar5);
    }
    this->data = pCVar1;
    for (iVar3 = 0; iVar3 < this->h; iVar3 = iVar3 + 1) {
      for (lVar4 = 0; (int)lVar4 < this->w; lVar4 = lVar4 + 1) {
        std::istream::_M_extract<float>((float *)&ifs);
        Complex::Complex(&local_240,real);
        this->data[(long)this->w * (long)iVar3 + lVar4] = local_240;
      }
    }
    std::ifstream::~ifstream(&ifs);
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Can\'t open image file ");
  poVar2 = std::operator<<(poVar2,filename);
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(1);
}

Assistant:

InputImage::InputImage(const char* filename) {
    std::ifstream ifs(filename);
    if(!ifs) {
        std::cout << "Can't open image file " << filename << std::endl;
        exit(1);
    }

    ifs >> w >> h;
    data = new Complex[w * h];
    for(int r = 0; r < h; ++r) {
        for(int c = 0; c < w; ++c) {
            float real;
            ifs >> real;
            data[r * w + c] = Complex(real);
        }
    }
}